

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q9.cpp
# Opt level: O0

bool rotation(string *str1,string *str2)

{
  anon_class_24_3_f17b84f1 __pred;
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  Index<unsigned_long> local_38;
  undefined1 local_29;
  ulong uStack_28;
  bool is_rotation;
  size_type check_start;
  string *str2_local;
  string *str1_local;
  
  check_start = (size_type)str2;
  str2_local = str1;
  lVar2 = std::__cxx11::string::size();
  lVar3 = std::__cxx11::string::size();
  if (lVar2 == lVar3) {
    for (uStack_28 = 0; uVar1 = uStack_28, uVar4 = std::__cxx11::string::size(), uVar1 < uVar4;
        uStack_28 = uStack_28 + 1) {
      local_40 = 0;
      local_38 = index<unsigned_long>(&local_40);
      local_50 = std::__cxx11::string::size();
      local_48 = (unsigned_long)index<unsigned_long>(&local_50);
      __pred.str2 = (string *)check_start;
      __pred.str1 = str2_local;
      __pred.check_start = uStack_28;
      local_29 = std::
                 all_of<Index<unsigned_long>,rotation(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                           (local_38,(Index<unsigned_long>)local_48,__pred);
      if ((bool)local_29) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool rotation(const std::string& str1, const std::string& str2){
  // rotations must have the same size
  if (str1.size() == str2.size()){
    // we use size_type of string
    using size_type = std::string::size_type;

    // position of str1 from which we start to check
    size_type check_start {0};

    // we increment check_start at each iteration so we compare str2
    // with every possible rotation of str1
    while (check_start < str1.size()){
      // we use this to flag if str2 matches with current rotation of
      // str1
      bool is_rotation {std::all_of(index<size_type>(0), index<size_type>(str2.size()),
                                    [&str1, &str2, check_start](const auto i) {
                                      return str1[(check_start + i) % str1.size()] == str2[i];
                                    })};

      // if str2 indeed matches current rotation of str1, then we
      // return true
      if (is_rotation){
        return true;
      }

      // next iteration we check another rotation of str1
      check_start++;
    }

    // if str2 matches no rotation of str1, then str2 is not a
    // rotation of str1
    return false;
  }
  // otherwise we simply return false
  else{
    return false;
  }
}